

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_for_bench.cpp
# Opt level: O1

void __thiscall EchoServer::echo_message_cb(EchoServer *this,TcpConnSP *conn,InputBuffer *ibuf)

{
  int iVar1;
  char *pcVar2;
  size_t in_RCX;
  uint in_R8D;
  string return_msg;
  string msg_str;
  long *local_60;
  uint local_58;
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  pcVar2 = InputBuffer::get_from_buf(ibuf);
  iVar1 = BufferBase::length(&ibuf->super_BufferBase);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,pcVar2,pcVar2 + iVar1);
  iVar1 = BufferBase::length(&ibuf->super_BufferBase);
  BufferBase::pop(&ibuf->super_BufferBase,iVar1);
  InputBuffer::adjust(ibuf);
  if (1 < pr_level) {
    in_R8D = ((conn->super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tc_fd;
    in_RCX = 0x23;
    printf("[%-5s][%s:%d] socket fd %d recv message:%s","info","echo_message_cb",0x23,(ulong)in_R8D,
           local_40[0]);
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "HTTP/1.1 200 OK\r\n\r\n<html><head><title>my title</title><body>Hello World!</body></head></html>"
             ,"");
  TcpConnection::send((conn->super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      (int)local_60,(void *)(ulong)local_58,in_RCX,in_R8D);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void echo_message_cb(const TcpConnSP& conn, InputBuffer* ibuf) {
        
        const char *msg = ibuf->get_from_buf();
        string msg_str(msg, msg+ibuf->length());
        ibuf->pop(ibuf->length());
        ibuf->adjust();
    
        PR_INFO("socket fd %d recv message:%s", conn->get_fd(), msg_str.c_str());

        string return_msg("HTTP/1.1 200 OK\r\n\r\n"
                "<html><head><title>my title</title><body>Hello World!</body></head></html>");

        conn->send(return_msg.c_str(), return_msg.length());
    }